

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_materialization.cpp
# Opt level: O2

void __thiscall
duckdb::CompressedMaterialization::CreateCompressProjection
          (CompressedMaterialization *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *child_op,
          vector<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_true>
          *compress_exprs,CompressedMaterializationInfo *info,CMChildInfo *child_info)

{
  vector<duckdb::ColumnBinding,_true> *this_00;
  pointer puVar1;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var2;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> _Var3;
  CompressedMaterializationInfo *pCVar4;
  pointer pCVar5;
  pointer pLVar6;
  pointer pLVar7;
  reference pvVar8;
  reference __args_1;
  const_reference __args_2;
  LogicalOperator *op;
  iterator __it;
  idx_t iVar9;
  reference this_01;
  idx_t iVar10;
  idx_t col_idx;
  ulong uVar11;
  vector<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_true>
  *__range1;
  pointer __k;
  unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>
  *compress_expr;
  pointer this_02;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  projections;
  ColumnBindingReplacer replacer;
  idx_t table_index;
  type binding_info_local;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> local_e0;
  CompressedMaterialization *local_d8;
  CompressedMaterializationInfo *local_d0;
  CMChildInfo *local_c8;
  vector<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_true>
  *local_c0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  local_b8;
  undefined1 local_98 [8];
  pointer local_90;
  pointer local_88;
  optional_ptr<duckdb::LogicalOperator,_true> local_78;
  idx_t local_70;
  CMBindingInfo local_68;
  
  local_b8.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8 = this;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::reserve((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_b8,
            (long)(compress_exprs->
                  super_vector<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(compress_exprs->
                  super_vector<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar1 = (compress_exprs->
           super_vector<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_02 = (compress_exprs->
                 super_vector<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_02 != puVar1; this_02 = this_02 + 1
      ) {
    pCVar5 = unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>
             ::operator->(this_02);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&local_b8,&pCVar5->expression);
  }
  local_70 = Binder::GenerateTableIndex(local_d8->optimizer->binder);
  make_uniq<duckdb::LogicalProjection,unsigned_long_const&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            ((duckdb *)&local_e0,&local_70,&local_b8);
  pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(child_op);
  if (pLVar6->has_estimated_cardinality == true) {
    pLVar7 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
             ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                           *)&local_e0);
    pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(child_op);
    LogicalOperator::SetEstimatedCardinality
              (&pLVar7->super_LogicalOperator,pLVar6->estimated_cardinality);
  }
  pLVar7 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
           ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                         *)&local_e0);
  LogicalOperator::ResolveOperatorTypes(&pLVar7->super_LogicalOperator);
  pLVar7 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
           ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                         *)&local_e0);
  ::std::
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
            ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
              *)&(pLVar7->super_LogicalOperator).children,child_op);
  _Var3._M_head_impl = local_e0._M_head_impl;
  local_e0._M_head_impl = (LogicalProjection *)0x0;
  _Var2._M_head_impl =
       (child_op->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (child_op->
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       &(_Var3._M_head_impl)->super_LogicalOperator;
  if (_Var2._M_head_impl != (LogicalOperator *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_LogicalOperator + 8))();
  }
  local_d0 = info;
  local_c0 = compress_exprs;
  pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(child_op);
  (*pLVar6->_vptr_LogicalOperator[2])(&local_68,pLVar6);
  this_00 = &child_info->bindings_after;
  ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::_M_move_assign
            (&this_00->super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>,
             &local_68);
  ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::~_Vector_base
            ((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
             &local_68);
  pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(child_op);
  ColumnBindingReplacer::ColumnBindingReplacer((ColumnBindingReplacer *)local_98);
  for (uVar11 = 0;
      uVar11 < (ulong)((long)(child_info->bindings_before).
                             super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                             .
                             super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(child_info->bindings_before).
                             super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                             .
                             super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4); uVar11 = uVar11 + 1) {
    pvVar8 = vector<duckdb::ColumnBinding,_true>::get<true>(&child_info->bindings_before,uVar11);
    __args_1 = vector<duckdb::ColumnBinding,_true>::get<true>(this_00,uVar11);
    __args_2 = vector<duckdb::LogicalType,_true>::get<true>(&pLVar6->types,uVar11);
    ::std::vector<duckdb::ReplacementBinding,std::allocator<duckdb::ReplacementBinding>>::
    emplace_back<duckdb::ColumnBinding_const&,duckdb::ColumnBinding_const&,duckdb::LogicalType_const&>
              ((vector<duckdb::ReplacementBinding,std::allocator<duckdb::ReplacementBinding>> *)
               &local_90,pvVar8,__args_1,__args_2);
    ::std::
    _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase(&local_d8->statistics_map->_M_h,pvVar8);
  }
  local_78.ptr = (child_op->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  op = optional_ptr<duckdb::LogicalOperator,_true>::operator*(&local_d8->root);
  ColumnBindingReplacer::VisitOperator((ColumnBindingReplacer *)local_98,op);
  local_c8 = child_info;
  for (__k = local_90; __k != local_88; __k = __k + 1) {
    __it = ::std::
           _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_d0,&__k->old_binding);
    if (__it.
        super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true>
        ._M_cur != (__node_type *)0x0) {
      iVar10 = (__k->old_binding).table_index;
      iVar9 = (__k->old_binding).column_index;
      if ((*(idx_t *)((long)__it.
                            super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true>
                            ._M_cur + 0x18) == iVar10) &&
         (*(idx_t *)((long)__it.
                           super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true>
                           ._M_cur + 0x20) == iVar9)) {
        iVar10 = (__k->new_binding).column_index;
        (((CMBindingInfo *)
         ((long)__it.
                super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true>
                ._M_cur + 0x18))->binding).table_index = (__k->new_binding).table_index;
        *(idx_t *)((long)__it.
                         super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true>
                         ._M_cur + 0x20) = iVar10;
        iVar10 = (__k->old_binding).table_index;
        iVar9 = (__k->old_binding).column_index;
      }
      if ((*(idx_t *)((long)__it.
                            super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true>
                            ._M_cur + 8) == iVar10) &&
         (*(idx_t *)((long)__it.
                           super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true>
                           ._M_cur + 0x10) == iVar9)) {
        CMBindingInfo::CMBindingInfo
                  (&local_68,
                   (CMBindingInfo *)
                   ((long)__it.
                          super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true>
                          ._M_cur + 0x18));
        pCVar4 = local_d0;
        ::std::
        _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::erase((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_d0,
                (const_iterator)
                __it.
                super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true>
                ._M_cur);
        ::std::
        _Hashtable<duckdb::ColumnBinding,std::pair<duckdb::ColumnBinding_const,duckdb::CMBindingInfo>,std::allocator<std::pair<duckdb::ColumnBinding_const,duckdb::CMBindingInfo>>,std::__detail::_Select1st,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<duckdb::ColumnBinding&,duckdb::CMBindingInfo>
                  ((_Hashtable<duckdb::ColumnBinding,std::pair<duckdb::ColumnBinding_const,duckdb::CMBindingInfo>,std::allocator<std::pair<duckdb::ColumnBinding_const,duckdb::CMBindingInfo>>,std::__detail::_Select1st,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)pCVar4,&__k->new_binding,&local_68);
        CMBindingInfo::~CMBindingInfo(&local_68);
        child_info = local_c8;
      }
    }
  }
  for (uVar11 = 0;
      uVar11 < (ulong)((long)(child_info->bindings_after).
                             super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                             .
                             super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(child_info->bindings_after).
                             super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                             .
                             super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4); uVar11 = uVar11 + 1) {
    pvVar8 = vector<duckdb::ColumnBinding,_true>::get<true>(this_00,uVar11);
    this_01 = vector<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_true>
              ::get<true>(local_c0,uVar11);
    pCVar5 = unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>
             ::operator->(this_01);
    ::std::
    _Hashtable<duckdb::ColumnBinding,std::pair<duckdb::ColumnBinding_const,duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>,std::allocator<std::pair<duckdb::ColumnBinding_const,duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>,std::__detail::_Select1st,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<duckdb::ColumnBinding_const&,duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
              ((_Hashtable<duckdb::ColumnBinding,std::pair<duckdb::ColumnBinding_const,duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>,std::allocator<std::pair<duckdb::ColumnBinding_const,duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>,std::__detail::_Select1st,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)local_d8->statistics_map,pvVar8,&pCVar5->stats);
  }
  ColumnBindingReplacer::~ColumnBindingReplacer((ColumnBindingReplacer *)local_98);
  if (local_e0._M_head_impl != (LogicalProjection *)0x0) {
    (*((local_e0._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_b8);
  return;
}

Assistant:

void CompressedMaterialization::CreateCompressProjection(unique_ptr<LogicalOperator> &child_op,
                                                         vector<unique_ptr<CompressExpression>> compress_exprs,
                                                         CompressedMaterializationInfo &info, CMChildInfo &child_info) {
	// Replace child op with a projection
	vector<unique_ptr<Expression>> projections;
	projections.reserve(compress_exprs.size());
	for (auto &compress_expr : compress_exprs) {
		projections.emplace_back(std::move(compress_expr->expression));
	}
	const auto table_index = optimizer.binder.GenerateTableIndex();
	auto compress_projection = make_uniq<LogicalProjection>(table_index, std::move(projections));
	if (child_op->has_estimated_cardinality) {
		compress_projection->SetEstimatedCardinality(child_op->estimated_cardinality);
	}
	compress_projection->ResolveOperatorTypes();

	compress_projection->children.emplace_back(std::move(child_op));
	child_op = std::move(compress_projection);

	// Get the new bindings and types
	child_info.bindings_after = child_op->GetColumnBindings();
	const auto &new_types = child_op->types;

	// Initialize a ColumnBindingReplacer with the new bindings and types
	ColumnBindingReplacer replacer;
	auto &replacement_bindings = replacer.replacement_bindings;
	for (idx_t col_idx = 0; col_idx < child_info.bindings_before.size(); col_idx++) {
		const auto &old_binding = child_info.bindings_before[col_idx];
		const auto &new_binding = child_info.bindings_after[col_idx];
		const auto &new_type = new_types[col_idx];
		replacement_bindings.emplace_back(old_binding, new_binding, new_type);

		// Remove the old binding from the statistics map
		statistics_map.erase(old_binding);
	}

	// Make sure we stop at the compress operator when replacing bindings
	replacer.stop_operator = child_op.get();

	// Make the plan consistent again
	replacer.VisitOperator(*root);

	// Replace in/out exprs in the binding map too
	auto &binding_map = info.binding_map;
	for (auto &replacement_binding : replacement_bindings) {
		auto it = binding_map.find(replacement_binding.old_binding);
		if (it == binding_map.end()) {
			continue;
		}
		auto &binding_info = it->second;
		if (binding_info.binding == replacement_binding.old_binding) {
			binding_info.binding = replacement_binding.new_binding;
		}

		if (it->first == replacement_binding.old_binding) {
			auto binding_info_local = std::move(binding_info);
			binding_map.erase(it);
			binding_map.emplace(replacement_binding.new_binding, std::move(binding_info_local));
		}
	}

	// Add projection stats to statistics map
	for (idx_t col_idx = 0; col_idx < child_info.bindings_after.size(); col_idx++) {
		const auto &binding = child_info.bindings_after[col_idx];
		auto &stats = compress_exprs[col_idx]->stats;
		statistics_map.emplace(binding, std::move(stats));
	}
}